

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Value * parse_number_value(char **string)

{
  parson_bool_t pVar1;
  int *piVar2;
  JSON_Value *pJVar3;
  double number_00;
  double number;
  char *end;
  char **string_local;
  
  end = (char *)string;
  piVar2 = __errno_location();
  *piVar2 = 0;
  number_00 = strtod(*(char **)end,(char **)&number);
  piVar2 = __errno_location();
  if ((*piVar2 == 0x22) && ((number_00 <= -INFINITY || (INFINITY <= number_00)))) {
    return (JSON_Value *)0x0;
  }
  piVar2 = __errno_location();
  if (((*piVar2 == 0) || (piVar2 = __errno_location(), *piVar2 == 0x22)) &&
     (pVar1 = is_decimal(*(char **)end,(long)number - *(long *)end), pVar1 != 0)) {
    *(double *)end = number;
    pJVar3 = json_value_init_number(number_00);
    return pJVar3;
  }
  return (JSON_Value *)0x0;
}

Assistant:

static JSON_Value * parse_number_value(const char **string) {
    char *end;
    double number = 0;
    errno = 0;
    number = strtod(*string, &end);
    if (errno == ERANGE && (number <= -HUGE_VAL || number >= HUGE_VAL)) {
        return NULL;
    }
    if ((errno && errno != ERANGE) || !is_decimal(*string, end - *string)) {
        return NULL;
    }
    *string = end;
    return json_value_init_number(number);
}